

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O3

void CreateBackwardReferencesNH42
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  long lVar1;
  ulong uVar2;
  ulong *puVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  BrotliEncoderDictionary *pBVar9;
  void *pvVar10;
  void *pvVar11;
  HasherCommon *pHVar12;
  BrotliDictionary *pBVar13;
  undefined8 uVar14;
  bool bVar15;
  ulong uVar16;
  bool bVar17;
  uint uVar18;
  uint32_t *addr_2;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  byte bVar22;
  size_t sVar23;
  long lVar24;
  ulong uVar25;
  uint8_t *puVar26;
  ulong *puVar27;
  uint uVar28;
  int iVar29;
  uint8_t *s1_orig_1;
  ulong uVar30;
  uint8_t *s1_orig_3;
  ulong uVar31;
  ulong uVar32;
  uint16_t uVar33;
  uint32_t uVar34;
  uint uVar35;
  size_t sVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  ulong uVar41;
  size_t sVar42;
  ushort uVar43;
  long lVar44;
  uint8_t *puVar45;
  uint32_t *addr;
  ulong *puVar46;
  uint8_t *s1_orig_4;
  ulong uVar47;
  ulong *puVar48;
  ulong uVar49;
  uint uVar50;
  int iVar51;
  long lVar52;
  size_t i;
  int iVar53;
  ulong local_178;
  ulong local_168;
  ulong local_160;
  size_t local_158;
  ulong local_150;
  ulong local_148;
  ulong local_130;
  ulong local_128;
  int local_114;
  ulong local_108;
  ulong local_100;
  Command *local_e0;
  uint local_cc;
  ulong local_c0;
  ulong local_b8;
  
  iVar51 = params->lgwin;
  sVar7 = params->stream_offset;
  uVar6 = (position - 3) + num_bytes;
  sVar23 = position;
  if (3 < num_bytes) {
    sVar23 = uVar6;
  }
  lVar24 = 0x200;
  if (params->quality < 9) {
    lVar24 = 0x40;
  }
  local_158 = *last_insert_len;
  sVar8 = (params->dictionary).compound.total_size;
  iVar29 = (int)*(undefined8 *)dist_cache;
  iVar53 = (int)((ulong)*(undefined8 *)dist_cache >> 0x20);
  dist_cache[4] = iVar29 + -1;
  dist_cache[5] = iVar29 + 1;
  dist_cache[6] = iVar29 + -2;
  dist_cache[7] = iVar29 + 2;
  dist_cache[8] = iVar29 + -3;
  dist_cache[9] = iVar29 + 3;
  dist_cache[10] = iVar53 + -1;
  dist_cache[0xb] = iVar53 + 1;
  dist_cache[0xc] = iVar53 + -2;
  dist_cache[0xd] = iVar53 + 2;
  dist_cache[0xe] = iVar53 + -3;
  dist_cache[0xf] = iVar53 + 3;
  uVar2 = position + num_bytes;
  if (uVar2 <= position + 4) {
    local_e0 = commands;
LAB_01115a8f:
    *last_insert_len = (local_158 + uVar2) - position;
    *num_commands = *num_commands + ((long)local_e0 - (long)commands >> 4);
    return;
  }
  uVar47 = (1L << ((byte)iVar51 & 0x3f)) - 0x10;
  local_100 = lVar24 + position;
  lVar1 = sVar8 + 1;
  lVar5 = position - 1;
  local_e0 = commands;
  sVar36 = position;
LAB_011145c0:
  uVar38 = uVar47;
  if (sVar36 < uVar47) {
    uVar38 = sVar36;
  }
  uVar30 = sVar7 + sVar36;
  if (uVar47 <= sVar7 + sVar36) {
    uVar30 = uVar47;
  }
  if ((params->dictionary).contextual.context_based == 0) {
    local_cc = 0;
    local_b8 = 0;
    goto LAB_0111464b;
  }
  if (sVar36 == 0) {
    local_b8 = 0;
LAB_01114622:
    uVar21 = 0;
  }
  else {
    local_b8 = (ulong)ringbuffer[sVar36 - 1 & ringbuffer_mask];
    if (sVar36 == 1) goto LAB_01114622;
    uVar21 = (ulong)ringbuffer[sVar36 - 2 & ringbuffer_mask];
  }
  local_cc = (uint)(params->dictionary).contextual.context_map
                   [literal_context_lut[uVar21 + 0x100] | literal_context_lut[local_b8]];
LAB_0111464b:
  local_148 = uVar2 - sVar36;
  pBVar9 = (params->dictionary).contextual.dict[local_cc];
  uVar21 = (params->dist).max_distance;
  pvVar10 = (hasher->privat)._H42.extra[0];
  pvVar11 = (hasher->privat)._H42.extra[1];
  uVar19 = sVar36 & ringbuffer_mask;
  puVar3 = (ulong *)(ringbuffer + uVar19);
  uVar28 = (uint)(*(int *)(ringbuffer + uVar19) * 0x1e35a7bd) >> 0x11;
  local_128 = 0x7e4;
  local_150 = 0;
  lVar20 = 0;
  local_178 = 0;
  local_108 = 0;
LAB_011146c2:
  uVar41 = (ulong)dist_cache[lVar20];
  uVar25 = sVar36 - uVar41;
  if ((((lVar20 == 0) || (*(char *)((long)pvVar10 + (uVar25 & 0xffff) + 0x30000) == (char)uVar28))
      && (uVar41 <= uVar38)) && (uVar25 < sVar36)) {
    puVar26 = ringbuffer + (uVar25 & ringbuffer_mask);
    puVar45 = puVar26;
    puVar48 = puVar3;
    uVar25 = local_148;
    if (7 < local_148) {
      lVar40 = 0;
      lVar52 = 0;
LAB_0111471c:
      if (*(ulong *)((long)puVar3 + lVar40) == *(ulong *)(puVar26 + lVar40)) goto code_r0x01114729;
      uVar31 = *(ulong *)(puVar26 + lVar40) ^ *(ulong *)((long)puVar3 + lVar40);
      uVar25 = 0;
      if (uVar31 != 0) {
        for (; (uVar31 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
        }
      }
      uVar25 = (uVar25 >> 3 & 0x1fffffff) - lVar52;
      goto LAB_011147a1;
    }
    goto LAB_01114759;
  }
  goto LAB_011147f3;
code_r0x01114729:
  lVar40 = lVar40 + 8;
  lVar44 = local_148 + lVar52;
  lVar52 = lVar52 + -8;
  if (lVar44 - 8U < 8) goto code_r0x01114743;
  goto LAB_0111471c;
code_r0x01114743:
  puVar45 = puVar26 + -lVar52;
  puVar48 = (ulong *)((long)puVar3 - lVar52);
  uVar25 = lVar52 + local_148;
LAB_01114759:
  if (uVar25 != 0) {
    uVar31 = 0;
    do {
      uVar49 = uVar31;
      if (puVar45[uVar31] != *(uint8_t *)((long)puVar48 + uVar31)) break;
      uVar31 = uVar31 + 1;
      uVar49 = uVar25;
    } while (uVar25 != uVar31);
    puVar45 = puVar45 + uVar49;
  }
  uVar25 = (long)puVar45 - (long)puVar26;
LAB_011147a1:
  if ((1 < uVar25) && (uVar31 = uVar25 * 0x87 + 0x78f, local_128 < uVar31)) {
    if (lVar20 != 0) {
      uVar31 = uVar31 - ((0x1ca10U >> ((byte)lVar20 & 0xe) & 0xe) + 0x27);
    }
    if (local_128 < uVar31) {
      local_108 = uVar41;
      local_178 = uVar25;
      local_150 = uVar25;
      local_128 = uVar31;
    }
  }
LAB_011147f3:
  lVar20 = lVar20 + 1;
  if (lVar20 == 0x10) goto code_r0x01114800;
  goto LAB_011146c2;
code_r0x01114800:
  uVar25 = (ulong)uVar28;
  uVar50 = uVar28 & 0x1ff;
  sVar42 = (hasher->privat)._H42.max_hops;
  uVar41 = sVar36 - *(uint *)((long)pvVar10 + uVar25 * 4);
  if (sVar42 != 0) {
    uVar43 = *(ushort *)((long)pvVar10 + uVar25 * 2 + 0x20000);
    uVar49 = 0;
    uVar31 = uVar41;
LAB_01114853:
    uVar49 = uVar31 + uVar49;
    if (uVar49 <= uVar38) {
      if (uVar19 + local_150 <= ringbuffer_mask) {
        uVar31 = sVar36 - uVar49 & ringbuffer_mask;
        uVar37 = local_150 + uVar31;
        if ((ringbuffer_mask < uVar37) || (ringbuffer[uVar19 + local_150] != ringbuffer[uVar37]))
        goto LAB_0111497b;
        puVar26 = ringbuffer + uVar31;
        uVar31 = local_148;
        puVar48 = puVar3;
        puVar45 = puVar26;
        if (7 < local_148) {
          lVar40 = 0;
          lVar20 = 0;
LAB_011148c1:
          if (*(ulong *)((long)puVar3 + lVar40) == *(ulong *)(puVar26 + lVar40))
          goto code_r0x011148cf;
          uVar37 = *(ulong *)(puVar26 + lVar40) ^ *(ulong *)((long)puVar3 + lVar40);
          uVar31 = 0;
          if (uVar37 != 0) {
            for (; (uVar37 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
            }
          }
          uVar31 = (uVar31 >> 3 & 0x1fffffff) - lVar20;
          goto LAB_01114941;
        }
        goto LAB_011148fa;
      }
      goto LAB_0111497b;
    }
  }
LAB_01114992:
  uVar43 = *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar50 * 2);
  *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar50 * 2) = uVar43 + 1;
  uVar18 = uVar43 & 0x1ff;
  *(char *)((long)pvVar10 + (sVar36 & 0xffff) + 0x30000) = (char)uVar28;
  if (0xfffe < uVar41) {
    uVar41 = 0xffff;
  }
  *(short *)((long)pvVar11 + (ulong)uVar18 * 4 + (ulong)(uVar50 << 0xb)) = (short)uVar41;
  *(undefined2 *)((long)pvVar11 + (ulong)uVar18 * 4 + (ulong)(uVar50 << 0xb) + 2) =
       *(undefined2 *)((long)pvVar10 + uVar25 * 2 + 0x20000);
  *(int *)((long)pvVar10 + uVar25 * 4) = (int)sVar36;
  *(short *)((long)pvVar10 + uVar25 * 2 + 0x20000) = (short)uVar18;
  if (local_128 == 0x7e4) {
    pHVar12 = (hasher->privat)._H42.common;
    uVar38 = pHVar12->dict_num_lookups;
    local_168 = pHVar12->dict_num_matches;
    if (uVar38 >> 7 <= local_168) {
      uVar19 = (ulong)((uint)((int)*puVar3 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
      puVar45 = pBVar9->hash_table_lengths;
      local_128 = 0x7e4;
      local_114 = 0;
      bVar17 = true;
LAB_01114a88:
      uVar38 = uVar38 + 1;
      pHVar12->dict_num_lookups = uVar38;
      bVar22 = puVar45[uVar19];
      uVar25 = (ulong)bVar22;
      if ((uVar25 != 0) && (uVar25 <= local_148)) {
        pBVar13 = pBVar9->words;
        puVar27 = (ulong *)(pBVar13->data +
                           (ulong)pBVar13->offsets_by_length[uVar25] +
                           pBVar9->hash_table_words[uVar19] * uVar25);
        puVar48 = puVar3;
        uVar41 = uVar25;
        if (7 < bVar22) {
          lVar20 = 0;
          puVar46 = puVar3;
LAB_01114af7:
          if (*puVar27 == *puVar46) goto code_r0x01114b02;
          uVar31 = *puVar46 ^ *puVar27;
          uVar41 = 0;
          if (uVar31 != 0) {
            for (; (uVar31 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
            }
          }
          uVar41 = (uVar41 >> 3 & 0x1fffffff) - lVar20;
          goto LAB_01114b6a;
        }
        goto LAB_01114b2e;
      }
      goto LAB_01114bfa;
    }
  }
  else {
    local_114 = 0;
LAB_01114c9d:
    if (0x7e4 < local_128) {
      uVar38 = local_158 + 4;
      lVar20 = (lVar5 + num_bytes) - sVar36;
      iVar51 = 0;
LAB_01114cd6:
      local_148 = local_148 - 1;
      local_130 = local_178 - 1;
      if (local_148 <= local_178 - 1) {
        local_130 = local_148;
      }
      if (4 < params->quality) {
        local_130 = 0;
      }
      uVar30 = sVar36 + 1;
      uVar21 = uVar47;
      if (uVar30 < uVar47) {
        uVar21 = uVar30;
      }
      local_c0 = sVar7 + sVar36 + 1;
      if (uVar47 <= local_c0) {
        local_c0 = uVar47;
      }
      if ((params->dictionary).contextual.context_based != 0) {
        local_cc = (uint)(params->dictionary).contextual.context_map
                         [literal_context_lut[local_b8 + 0x100] |
                          literal_context_lut[ringbuffer[sVar36 & ringbuffer_mask]]];
        local_b8 = (ulong)ringbuffer[sVar36 & ringbuffer_mask];
      }
      pBVar9 = (params->dictionary).contextual.dict[local_cc];
      uVar19 = (params->dist).max_distance;
      pvVar10 = (hasher->privat)._H42.extra[0];
      pvVar11 = (hasher->privat)._H42.extra[1];
      uVar41 = uVar30 & ringbuffer_mask;
      puVar3 = (ulong *)(ringbuffer + uVar41);
      uVar28 = (uint)(*(int *)(ringbuffer + uVar41) * 0x1e35a7bd) >> 0x11;
      uVar25 = 0x7e4;
      lVar40 = 0;
      local_168 = 0;
      local_160 = 0;
LAB_01114df4:
      uVar49 = (ulong)dist_cache[lVar40];
      uVar31 = uVar30 - uVar49;
      if (((lVar40 == 0) || (*(char *)((long)pvVar10 + (uVar31 & 0xffff) + 0x30000) == (char)uVar28)
          ) && ((uVar49 <= uVar21 && (uVar31 < uVar30)))) {
        puVar26 = ringbuffer + (uVar31 & ringbuffer_mask);
        puVar45 = puVar26;
        uVar31 = local_148;
        puVar48 = puVar3;
        if (7 < local_148) {
          lVar44 = 0;
          lVar52 = 0;
LAB_01114e49:
          if (*(ulong *)((long)puVar3 + lVar44) == *(ulong *)(puVar26 + lVar44))
          goto code_r0x01114e56;
          uVar37 = *(ulong *)(puVar26 + lVar44) ^ *(ulong *)((long)puVar3 + lVar44);
          uVar31 = 0;
          if (uVar37 != 0) {
            for (; (uVar37 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
            }
          }
          uVar31 = (uVar31 >> 3 & 0x1fffffff) - lVar52;
          goto LAB_01114ed8;
        }
        goto LAB_01114e80;
      }
      goto LAB_01114f22;
    }
  }
  local_158 = local_158 + 1;
  position = sVar36 + 1;
  if (local_100 < position) {
    if ((uint)((int)lVar24 * 4) + local_100 < position) {
      uVar38 = sVar36 + 0x11;
      if (uVar2 - 4 <= sVar36 + 0x11) {
        uVar38 = uVar2 - 4;
      }
      if (position < uVar38) {
        pvVar10 = (hasher->privat)._H42.extra[0];
        pvVar11 = (hasher->privat)._H42.extra[1];
        do {
          uVar28 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
          uVar30 = (ulong)uVar28;
          uVar18 = uVar28 & 0x1ff;
          uVar43 = *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar18 * 2);
          *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar18 * 2) = uVar43 + 1;
          uVar50 = uVar43 & 0x1ff;
          uVar21 = position - *(uint *)((long)pvVar10 + uVar30 * 4);
          if (0xfffe < uVar21) {
            uVar21 = 0xffff;
          }
          *(char *)((long)pvVar10 + (position & 0xffff) + 0x30000) = (char)uVar28;
          *(short *)((long)pvVar11 + (ulong)uVar50 * 4 + (ulong)(uVar18 << 0xb)) = (short)uVar21;
          *(undefined2 *)((long)pvVar11 + (ulong)uVar50 * 4 + (ulong)(uVar18 << 0xb) + 2) =
               *(undefined2 *)((long)pvVar10 + uVar30 * 2 + 0x20000);
          *(int *)((long)pvVar10 + uVar30 * 4) = (int)position;
          *(short *)((long)pvVar10 + uVar30 * 2 + 0x20000) = (short)uVar50;
          local_158 = local_158 + 4;
          position = position + 4;
        } while (position < uVar38);
      }
    }
    else {
      uVar38 = sVar36 + 9;
      if (uVar6 <= sVar36 + 9) {
        uVar38 = uVar6;
      }
      if (position < uVar38) {
        pvVar10 = (hasher->privat)._H42.extra[0];
        pvVar11 = (hasher->privat)._H42.extra[1];
        do {
          uVar28 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
          uVar30 = (ulong)uVar28;
          uVar18 = uVar28 & 0x1ff;
          uVar43 = *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar18 * 2);
          *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar18 * 2) = uVar43 + 1;
          uVar50 = uVar43 & 0x1ff;
          uVar21 = position - *(uint *)((long)pvVar10 + uVar30 * 4);
          if (0xfffe < uVar21) {
            uVar21 = 0xffff;
          }
          *(char *)((long)pvVar10 + (position & 0xffff) + 0x30000) = (char)uVar28;
          *(short *)((long)pvVar11 + (ulong)uVar50 * 4 + (ulong)(uVar18 << 0xb)) = (short)uVar21;
          *(undefined2 *)((long)pvVar11 + (ulong)uVar50 * 4 + (ulong)(uVar18 << 0xb) + 2) =
               *(undefined2 *)((long)pvVar10 + uVar30 * 2 + 0x20000);
          *(int *)((long)pvVar10 + uVar30 * 4) = (int)position;
          *(short *)((long)pvVar10 + uVar30 * 2 + 0x20000) = (short)uVar50;
          local_158 = local_158 + 2;
          position = position + 2;
        } while (position < uVar38);
      }
    }
  }
  goto LAB_01115a2b;
code_r0x011148cf:
  lVar40 = lVar40 + 8;
  lVar52 = local_148 + lVar20;
  lVar20 = lVar20 + -8;
  if (lVar52 - 8U < 8) goto code_r0x011148e9;
  goto LAB_011148c1;
code_r0x011148e9:
  puVar45 = puVar26 + -lVar20;
  puVar48 = (ulong *)((long)puVar3 - lVar20);
  uVar31 = lVar20 + local_148;
LAB_011148fa:
  if (uVar31 != 0) {
    uVar37 = 0;
    do {
      uVar32 = uVar37;
      if (puVar45[uVar37] != *(uint8_t *)((long)puVar48 + uVar37)) break;
      uVar37 = uVar37 + 1;
      uVar32 = uVar31;
    } while (uVar31 != uVar37);
    puVar45 = puVar45 + uVar32;
  }
  uVar31 = (long)puVar45 - (long)puVar26;
LAB_01114941:
  if (3 < uVar31) {
    iVar51 = 0x1f;
    if ((uint)uVar49 != 0) {
      for (; (uint)uVar49 >> iVar51 == 0; iVar51 = iVar51 + -1) {
      }
    }
    uVar37 = (ulong)(iVar51 * -0x1e + 0x780) + uVar31 * 0x87;
    if (local_128 < uVar37) {
      local_108 = uVar49;
      local_178 = uVar31;
      local_150 = uVar31;
      local_128 = uVar37;
    }
  }
LAB_0111497b:
  uVar31 = (ulong)uVar43;
  uVar43 = *(ushort *)((long)pvVar11 + uVar31 * 4 + (ulong)(uVar50 << 0xb) + 2);
  uVar31 = (ulong)*(ushort *)((long)pvVar11 + uVar31 * 4 + (ulong)(uVar50 << 0xb));
  sVar42 = sVar42 - 1;
  if (sVar42 == 0) goto LAB_01114992;
  goto LAB_01114853;
code_r0x01114b02:
  puVar27 = puVar27 + 1;
  puVar46 = puVar46 + 1;
  lVar40 = uVar25 + lVar20;
  lVar20 = lVar20 + -8;
  if (lVar40 - 8U < 8) goto code_r0x01114b1c;
  goto LAB_01114af7;
code_r0x01114b1c:
  puVar48 = puVar46;
  uVar41 = lVar20 + uVar25;
  if (lVar20 + uVar25 != 0) {
LAB_01114b2e:
    puVar46 = (ulong *)((long)puVar48 + uVar41);
    uVar31 = 0;
    do {
      if (*(char *)((long)puVar48 + uVar31) != *(char *)((long)puVar27 + uVar31)) {
        puVar46 = (ulong *)((long)puVar48 + uVar31);
        break;
      }
      uVar31 = uVar31 + 1;
    } while (uVar41 != uVar31);
  }
  uVar41 = (long)puVar46 - (long)puVar3;
LAB_01114b6a:
  if (((uVar41 != 0) && (uVar25 < pBVar9->cutoffTransformsCount + uVar41)) &&
     (uVar25 = (ulong)pBVar9->hash_table_words[uVar19] + uVar30 + lVar1 +
               ((ulong)((uint)(pBVar9->cutoffTransforms >>
                              ((char)(uVar25 - uVar41) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar25 - uVar41) * 4 << (pBVar13->size_bits_by_length[uVar25] & 0x3f)),
     uVar25 <= uVar21)) {
    iVar51 = 0x1f;
    if ((uint)uVar25 != 0) {
      for (; (uint)uVar25 >> iVar51 == 0; iVar51 = iVar51 + -1) {
      }
    }
    uVar31 = (uVar41 * 0x87 - (ulong)(uint)(iVar51 * 0x1e)) + 0x780;
    if (local_128 <= uVar31) {
      local_114 = (uint)bVar22 - (int)uVar41;
      local_168 = local_168 + 1;
      pHVar12->dict_num_matches = local_168;
      local_108 = uVar25;
      local_178 = uVar41;
      local_128 = uVar31;
    }
  }
LAB_01114bfa:
  uVar19 = uVar19 + 1;
  bVar15 = !bVar17;
  bVar17 = false;
  if (bVar15) goto LAB_01114c9d;
  goto LAB_01114a88;
code_r0x01114e56:
  lVar44 = lVar44 + 8;
  lVar4 = lVar20 + lVar52;
  lVar52 = lVar52 + -8;
  if (lVar4 - 8U < 8) goto code_r0x01114e6c;
  goto LAB_01114e49;
code_r0x01114e6c:
  puVar45 = puVar26 + -lVar52;
  puVar48 = (ulong *)((long)puVar3 - lVar52);
  uVar31 = lVar52 + lVar20;
LAB_01114e80:
  if (uVar31 != 0) {
    uVar37 = 0;
    do {
      uVar32 = uVar37;
      if (puVar45[uVar37] != *(uint8_t *)((long)puVar48 + uVar37)) break;
      uVar37 = uVar37 + 1;
      uVar32 = uVar31;
    } while (uVar31 != uVar37);
    puVar45 = puVar45 + uVar32;
  }
  uVar31 = (long)puVar45 - (long)puVar26;
LAB_01114ed8:
  if ((1 < uVar31) && (uVar37 = uVar31 * 0x87 + 0x78f, uVar25 < uVar37)) {
    if (lVar40 != 0) {
      uVar37 = uVar37 - ((0x1ca10U >> ((byte)lVar40 & 0xe) & 0xe) + 0x27);
    }
    if (uVar25 < uVar37) {
      uVar25 = uVar37;
      local_168 = uVar31;
      local_160 = uVar49;
      local_130 = uVar31;
    }
  }
LAB_01114f22:
  lVar40 = lVar40 + 1;
  if (lVar40 == 0x10) goto code_r0x01114f2f;
  goto LAB_01114df4;
code_r0x01114f2f:
  uVar31 = (ulong)uVar28;
  uVar50 = uVar28 & 0x1ff;
  sVar42 = (hasher->privat)._H42.max_hops;
  uVar49 = uVar30 - *(uint *)((long)pvVar10 + uVar31 * 4);
  if (sVar42 != 0) {
    uVar43 = *(ushort *)((long)pvVar10 + uVar31 * 2 + 0x20000);
    uVar32 = 0;
    uVar37 = uVar49;
LAB_01114f87:
    uVar32 = uVar37 + uVar32;
    if (uVar32 <= uVar21) {
      if (local_130 + uVar41 <= ringbuffer_mask) {
        uVar39 = uVar30 - uVar32 & ringbuffer_mask;
        uVar37 = uVar39 + local_130;
        if ((ringbuffer_mask < uVar37) || (ringbuffer[local_130 + uVar41] != ringbuffer[uVar37]))
        goto LAB_01115060;
        puVar26 = ringbuffer + uVar39;
        puVar48 = puVar3;
        puVar45 = puVar26;
        uVar37 = local_148;
        if (7 < local_148) {
          lVar40 = 0;
          lVar52 = 0;
LAB_01114ff2:
          if (*(ulong *)((long)puVar3 + lVar40) == *(ulong *)(puVar26 + lVar40))
          goto code_r0x01114fff;
          uVar39 = *(ulong *)(puVar26 + lVar40) ^ *(ulong *)((long)puVar3 + lVar40);
          uVar37 = 0;
          if (uVar39 != 0) {
            for (; (uVar39 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
            }
          }
          uVar37 = (uVar37 >> 3 & 0x1fffffff) - lVar52;
          goto LAB_01115094;
        }
        goto LAB_01115024;
      }
      goto LAB_01115060;
    }
  }
LAB_011150d6:
  uVar43 = *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar50 * 2);
  *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar50 * 2) = uVar43 + 1;
  uVar18 = uVar43 & 0x1ff;
  *(char *)((long)pvVar10 + (uVar30 & 0xffff) + 0x30000) = (char)uVar28;
  if (0xfffe < uVar49) {
    uVar49 = 0xffff;
  }
  *(short *)((long)pvVar11 + (ulong)uVar18 * 4 + (ulong)(uVar50 << 0xb)) = (short)uVar49;
  *(undefined2 *)((long)pvVar11 + (ulong)uVar18 * 4 + (ulong)(uVar50 << 0xb) + 2) =
       *(undefined2 *)((long)pvVar10 + uVar31 * 2 + 0x20000);
  *(int *)((long)pvVar10 + uVar31 * 4) = (int)uVar30;
  *(short *)((long)pvVar10 + uVar31 * 2 + 0x20000) = (short)uVar18;
  if (uVar25 == 0x7e4) {
    pHVar12 = (hasher->privat)._H42.common;
    uVar21 = pHVar12->dict_num_lookups;
    local_100 = pHVar12->dict_num_matches;
    uVar25 = 0x7e4;
    if (uVar21 >> 7 <= local_100) {
      uVar41 = (ulong)((uint)((int)*puVar3 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
      puVar45 = pBVar9->hash_table_lengths;
      iVar29 = 0;
      uVar25 = 0x7e4;
      bVar17 = true;
LAB_0111524b:
      uVar21 = uVar21 + 1;
      pHVar12->dict_num_lookups = uVar21;
      bVar22 = puVar45[uVar41];
      uVar31 = (ulong)bVar22;
      if ((uVar31 != 0) && (uVar31 <= local_148)) {
        pBVar13 = pBVar9->words;
        puVar27 = (ulong *)(pBVar13->data +
                           (ulong)pBVar13->offsets_by_length[uVar31] +
                           pBVar9->hash_table_words[uVar41] * uVar31);
        uVar49 = uVar31;
        puVar48 = puVar3;
        if (7 < bVar22) {
          lVar40 = 0;
LAB_011152c0:
          if (*puVar27 == *puVar48) goto code_r0x011152cc;
          uVar37 = *puVar48 ^ *puVar27;
          uVar49 = 0;
          if (uVar37 != 0) {
            for (; (uVar37 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
            }
          }
          uVar49 = (uVar49 >> 3 & 0x1fffffff) - lVar40;
          goto LAB_0111532e;
        }
        goto LAB_011152f3;
      }
      goto LAB_01115273;
    }
  }
  iVar29 = 0;
LAB_01115191:
  if (uVar25 < local_128 + 0xaf) {
    uVar30 = sVar36;
    local_168 = local_178;
    iVar29 = local_114;
    sVar42 = local_158;
    local_c0 = sVar36 + sVar7;
    if (uVar47 <= sVar36 + sVar7) {
      local_c0 = uVar47;
    }
    goto LAB_0111563c;
  }
  local_108 = local_160;
  sVar42 = uVar38;
  if (iVar51 == 3) goto LAB_0111563c;
  local_158 = local_158 + 1;
  iVar51 = iVar51 + 1;
  uVar21 = sVar36 + 5;
  lVar20 = lVar20 + -1;
  local_178 = local_168;
  sVar36 = uVar30;
  sVar42 = local_158;
  local_128 = uVar25;
  local_114 = iVar29;
  if (uVar2 <= uVar21) goto LAB_0111563c;
  goto LAB_01114cd6;
code_r0x01114fff:
  lVar40 = lVar40 + 8;
  lVar44 = lVar20 + lVar52;
  lVar52 = lVar52 + -8;
  if (lVar44 - 8U < 8) goto code_r0x01115015;
  goto LAB_01114ff2;
code_r0x01115015:
  puVar45 = puVar26 + -lVar52;
  puVar48 = (ulong *)((long)puVar3 - lVar52);
  uVar37 = lVar52 + lVar20;
LAB_01115024:
  if (uVar37 != 0) {
    uVar39 = 0;
    do {
      uVar16 = uVar39;
      if (puVar45[uVar39] != *(uint8_t *)((long)puVar48 + uVar39)) break;
      uVar39 = uVar39 + 1;
      uVar16 = uVar37;
    } while (uVar37 != uVar39);
    puVar45 = puVar45 + uVar16;
  }
  uVar37 = (long)puVar45 - (long)puVar26;
LAB_01115094:
  if (3 < uVar37) {
    iVar29 = 0x1f;
    if ((uint)uVar32 != 0) {
      for (; (uint)uVar32 >> iVar29 == 0; iVar29 = iVar29 + -1) {
      }
    }
    uVar39 = (ulong)(iVar29 * -0x1e + 0x780) + uVar37 * 0x87;
    if (uVar25 < uVar39) {
      uVar25 = uVar39;
      local_168 = uVar37;
      local_160 = uVar32;
      local_130 = uVar37;
    }
  }
LAB_01115060:
  uVar37 = (ulong)uVar43;
  uVar43 = *(ushort *)((long)pvVar11 + uVar37 * 4 + (ulong)(uVar50 << 0xb) + 2);
  uVar37 = (ulong)*(ushort *)((long)pvVar11 + uVar37 * 4 + (ulong)(uVar50 << 0xb));
  sVar42 = sVar42 - 1;
  if (sVar42 == 0) goto LAB_011150d6;
  goto LAB_01114f87;
code_r0x011152cc:
  puVar27 = puVar27 + 1;
  puVar48 = puVar48 + 1;
  lVar52 = uVar31 + lVar40;
  lVar40 = lVar40 + -8;
  if (lVar52 - 8U < 8) goto code_r0x011152e6;
  goto LAB_011152c0;
code_r0x011152e6:
  uVar49 = lVar40 + uVar31;
  if (lVar40 + uVar31 != 0) {
LAB_011152f3:
    uVar37 = 0;
    do {
      uVar32 = uVar37;
      if (*(char *)((long)puVar48 + uVar37) != *(char *)((long)puVar27 + uVar37)) break;
      uVar37 = uVar37 + 1;
      uVar32 = uVar49;
    } while (uVar49 != uVar37);
    puVar48 = (ulong *)((long)puVar48 + uVar32);
  }
  uVar49 = (long)puVar48 - (long)puVar3;
LAB_0111532e:
  if (((uVar49 != 0) && (uVar31 < pBVar9->cutoffTransformsCount + uVar49)) &&
     (uVar31 = (ulong)pBVar9->hash_table_words[uVar41] + lVar1 + local_c0 +
               ((ulong)((uint)(pBVar9->cutoffTransforms >>
                              ((char)(uVar31 - uVar49) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar31 - uVar49) * 4 << (pBVar13->size_bits_by_length[uVar31] & 0x3f)),
     uVar31 <= uVar19)) {
    iVar53 = 0x1f;
    if ((uint)uVar31 != 0) {
      for (; (uint)uVar31 >> iVar53 == 0; iVar53 = iVar53 + -1) {
      }
    }
    uVar37 = (uVar49 * 0x87 - (ulong)(uint)(iVar53 * 0x1e)) + 0x780;
    if (uVar25 <= uVar37) {
      iVar29 = (uint)bVar22 - (int)uVar49;
      local_100 = local_100 + 1;
      pHVar12->dict_num_matches = local_100;
      local_160 = uVar31;
      local_168 = uVar49;
      uVar25 = uVar37;
    }
  }
LAB_01115273:
  uVar41 = uVar41 + 1;
  bVar15 = !bVar17;
  bVar17 = false;
  if (bVar15) goto LAB_01115191;
  goto LAB_0111524b;
LAB_0111563c:
  local_158 = sVar42;
  local_c0 = local_c0 + sVar8;
  if (local_c0 < local_108) {
LAB_01115656:
    uVar38 = local_108 + 0xf;
LAB_0111565a:
    if ((local_108 <= local_c0) && (uVar38 != 0)) {
      dist_cache[3] = dist_cache[2];
      uVar14 = *(undefined8 *)dist_cache;
      *(undefined8 *)(dist_cache + 1) = uVar14;
      iVar51 = (int)local_108;
      *dist_cache = iVar51;
      dist_cache[4] = iVar51 + -1;
      dist_cache[5] = iVar51 + 1;
      dist_cache[6] = iVar51 + -2;
      dist_cache[7] = iVar51 + 2;
      dist_cache[8] = iVar51 + -3;
      dist_cache[9] = iVar51 + 3;
      iVar51 = (int)uVar14;
      dist_cache[10] = iVar51 + -1;
      dist_cache[0xb] = iVar51 + 1;
      dist_cache[0xc] = iVar51 + -2;
      dist_cache[0xd] = iVar51 + 2;
      *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar51 + 3,iVar51 + -3);
    }
  }
  else {
    if (local_108 != (long)*dist_cache) {
      uVar38 = 1;
      if (local_108 != (long)dist_cache[1]) {
        uVar38 = (local_108 + 3) - (long)*dist_cache;
        if (uVar38 < 7) {
          bVar22 = (byte)((int)uVar38 << 2);
          uVar28 = 0x9750468;
        }
        else {
          uVar38 = (local_108 + 3) - (long)dist_cache[1];
          if (6 < uVar38) {
            uVar38 = 2;
            if ((local_108 != (long)dist_cache[2]) && (uVar38 = 3, local_108 != (long)dist_cache[3])
               ) goto LAB_01115656;
            goto LAB_0111565a;
          }
          bVar22 = (byte)((int)uVar38 << 2);
          uVar28 = 0xfdb1ace;
        }
        uVar38 = (ulong)(uVar28 >> (bVar22 & 0x1f) & 0xf);
      }
      goto LAB_0111565a;
    }
    uVar38 = 0;
  }
  uVar28 = (uint)local_158;
  local_e0->insert_len_ = uVar28;
  local_e0->copy_len_ = iVar29 << 0x19 | (uint)local_168;
  uVar19 = (ulong)(params->dist).num_direct_distance_codes;
  uVar21 = uVar19 + 0x10;
  uVar34 = 0;
  if (uVar21 <= uVar38) {
    uVar50 = (params->dist).distance_postfix_bits;
    bVar22 = (byte)uVar50;
    uVar19 = ((4L << (bVar22 & 0x3f)) + (uVar38 - uVar19)) - 0x10;
    uVar18 = 0x1f;
    uVar35 = (uint)uVar19;
    if (uVar35 != 0) {
      for (; uVar35 >> uVar18 == 0; uVar18 = uVar18 - 1) {
      }
    }
    uVar18 = (uVar18 ^ 0xffffffe0) + 0x1f;
    uVar25 = (ulong)((uVar19 >> ((ulong)uVar18 & 0x3f) & 1) != 0);
    lVar20 = (ulong)uVar18 - (ulong)uVar50;
    uVar38 = (~(-1 << (bVar22 & 0x1f)) & uVar35) + uVar21 +
             (uVar25 + lVar20 * 2 + 0xfffe << (bVar22 & 0x3f)) | lVar20 * 0x400;
    uVar34 = (uint32_t)(uVar19 - (uVar25 + 2 << ((byte)uVar18 & 0x3f)) >> (bVar22 & 0x3f));
  }
  local_e0->dist_prefix_ = (uint16_t)uVar38;
  local_e0->dist_extra_ = uVar34;
  if (5 < local_158) {
    if (local_158 < 0x82) {
      uVar28 = 0x1f;
      uVar50 = (uint)(local_158 - 2);
      if (uVar50 != 0) {
        for (; uVar50 >> uVar28 == 0; uVar28 = uVar28 - 1) {
        }
      }
      uVar28 = (int)(local_158 - 2 >> ((char)(uVar28 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar28 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_158 < 0x842) {
      uVar50 = 0x1f;
      if (uVar28 - 0x42 != 0) {
        for (; uVar28 - 0x42 >> uVar50 == 0; uVar50 = uVar50 - 1) {
        }
      }
      uVar28 = (uVar50 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar28 = 0x15;
      if (0x1841 < local_158) {
        uVar28 = (uint)(ushort)(0x17 - (local_158 < 0x5842));
      }
    }
  }
  uVar50 = iVar29 + (uint)local_168;
  if (uVar50 < 10) {
    uVar18 = uVar50 - 2;
  }
  else if (uVar50 < 0x86) {
    uVar50 = uVar50 - 6;
    uVar18 = 0x1f;
    if (uVar50 != 0) {
      for (; uVar50 >> uVar18 == 0; uVar18 = uVar18 - 1) {
      }
    }
    uVar18 = (uVar50 >> ((char)(uVar18 ^ 0xffffffe0) + 0x1fU & 0x1f)) + 0x42 +
             (uVar18 ^ 0xffffffe0) * 2;
  }
  else {
    uVar18 = 0x17;
    if (uVar50 < 0x846) {
      uVar18 = 0x1f;
      if (uVar50 - 0x46 != 0) {
        for (; uVar50 - 0x46 >> uVar18 == 0; uVar18 = uVar18 - 1) {
        }
      }
      uVar18 = (uVar18 ^ 0xffe0) + 0x2c;
    }
  }
  uVar43 = (ushort)uVar18;
  uVar33 = (uVar43 & 7) + ((ushort)uVar28 & 7) * 8;
  if ((((uVar38 & 0x3ff) == 0) && ((ushort)uVar28 < 8)) && (uVar43 < 0x10)) {
    if (7 < uVar43) {
      uVar33 = uVar33 + 0x40;
    }
  }
  else {
    iVar51 = ((uVar28 & 0xffff) >> 3) * 3 + ((uVar18 & 0xffff) >> 3);
    uVar33 = uVar33 + ((ushort)(0x520d40 >> ((char)iVar51 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar51 * 0x40 + 0x40;
  }
  local_e0->cmd_prefix_ = uVar33;
  *num_literals = *num_literals + local_158;
  position = local_168 + uVar30;
  uVar38 = sVar23;
  if (position < sVar23) {
    uVar38 = position;
  }
  uVar21 = uVar30 + 2;
  if (local_108 < local_168 >> 2) {
    uVar19 = position + local_108 * -4;
    if (uVar19 < uVar21) {
      uVar19 = uVar21;
    }
    uVar21 = uVar19;
    if (uVar38 < uVar19) {
      uVar21 = uVar38;
    }
  }
  local_100 = local_168 * 2 + uVar30 + lVar24;
  local_e0 = local_e0 + 1;
  if (uVar21 < uVar38) {
    pvVar10 = (hasher->privat)._H42.extra[0];
    pvVar11 = (hasher->privat)._H42.extra[1];
    do {
      uVar28 = (uint)(*(int *)(ringbuffer + (uVar21 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
      uVar19 = (ulong)uVar28;
      uVar18 = uVar28 & 0x1ff;
      uVar43 = *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar18 * 2);
      *(ushort *)((long)(&hasher->common + 1) + (ulong)uVar18 * 2) = uVar43 + 1;
      uVar50 = uVar43 & 0x1ff;
      uVar30 = uVar21 - *(uint *)((long)pvVar10 + uVar19 * 4);
      *(char *)((long)pvVar10 + (uVar21 & 0xffff) + 0x30000) = (char)uVar28;
      if (0xfffe < uVar30) {
        uVar30 = 0xffff;
      }
      *(short *)((long)pvVar11 + (ulong)uVar50 * 4 + (ulong)(uVar18 << 0xb)) = (short)uVar30;
      *(undefined2 *)((long)pvVar11 + (ulong)uVar50 * 4 + (ulong)(uVar18 << 0xb) + 2) =
           *(undefined2 *)((long)pvVar10 + uVar19 * 2 + 0x20000);
      *(int *)((long)pvVar10 + uVar19 * 4) = (int)uVar21;
      *(short *)((long)pvVar10 + uVar19 * 2 + 0x20000) = (short)uVar50;
      uVar21 = uVar21 + 1;
    } while (uVar38 != uVar21);
    local_158 = 0;
  }
  else {
    local_158 = 0;
  }
LAB_01115a2b:
  sVar36 = position;
  if (uVar2 <= position + 4) goto LAB_01115a8f;
  goto LAB_011145c0;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}